

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

UBool __thiscall icu_63::OlsonTimeZone::operator==(OlsonTimeZone *this,TimeZone *other)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  
  if (this == (OlsonTimeZone *)other) {
    return '\x01';
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)
                     (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  if ((bVar1) && (UVar2 = TimeZone::operator==((TimeZone *)this,other), UVar2 != '\0')) {
    iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xb])
                      (this,other);
    return (char)iVar3 != '\0';
  }
  return '\0';
}

Assistant:

UBool OlsonTimeZone::operator==(const TimeZone& other) const {
    return ((this == &other) ||
            (typeid(*this) == typeid(other) &&
            TimeZone::operator==(other) &&
            hasSameRules(other)));
}